

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O0

Euclidean_distance_matrix *
read_point_cloud(Euclidean_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this;
  bool bVar1;
  vertex_t vVar2;
  istream *piVar3;
  long *plVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  ostream *poVar8;
  vertex_t n;
  size_t d;
  istringstream s;
  undefined1 local_80 [8];
  vector<float,_std::allocator<float>_> point;
  float local_54;
  string local_50 [4];
  value_t value;
  string line;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  istream *input_stream_local;
  Euclidean_distance_matrix *eucl_dist;
  
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)((long)&line.field_2 + 8));
  std::__cxx11::string::string(local_50);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(input_stream,local_50);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      this = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)((long)&line.field_2 + 8);
      pvVar6 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::front(this);
      sVar7 = std::vector<float,_std::allocator<float>_>::size(pvVar6);
      Gudhi::ripser::Euclidean_distance_matrix<Params>::Euclidean_distance_matrix
                (__return_storage_ptr__,this);
      vVar2 = Gudhi::ripser::Euclidean_distance_matrix<Params>::size(__return_storage_ptr__);
      poVar8 = std::operator<<((ostream *)&std::cout,"point cloud with ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,vVar2);
      poVar8 = std::operator<<(poVar8," points in dimension ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar7);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_50);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)((long)&line.field_2 + 8));
      return __return_storage_ptr__;
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_80);
    std::__cxx11::istringstream::istringstream((istringstream *)&d,local_50,8);
    while( true ) {
      plVar4 = (long *)std::istream::operator>>(&d,&local_54);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar1) break;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)local_80,&local_54);
      std::istream::ignore();
    }
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)local_80);
    if (!bVar1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)((long)&line.field_2 + 8),(value_type *)local_80);
    }
    sVar7 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_80);
    pvVar6 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::front((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)((long)&line.field_2 + 8));
    sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar6);
    if (sVar7 != sVar5) break;
    std::__cxx11::istringstream::~istringstream((istringstream *)&d);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_80);
  }
  __assert_fail("point.size() == points.front().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Ripser/utilities/ripser.cc"
                ,0x6a,"Euclidean_distance_matrix read_point_cloud(std::istream &)");
}

Assistant:

Euclidean_distance_matrix read_point_cloud(std::istream& input_stream) {
  std::vector<std::vector<value_t>> points;

  std::string line;
  value_t value;
  while (std::getline(input_stream, line)) {
    std::vector<value_t> point;
    std::istringstream s(line);
    while (s >> value) {
      point.push_back(value);
      s.ignore();
    }
    if (!point.empty()) points.push_back(point);
    assert(point.size() == points.front().size());
  }

  std::size_t d = points.front().size();
  Euclidean_distance_matrix eucl_dist(std::move(points));
  vertex_t n = eucl_dist.size();
  std::cout << "point cloud with " << n << " points in dimension "
    << d << std::endl;

  return eucl_dist;
}